

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_getfreeblock(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar7;
  int *piVar8;
  char cVar9;
  DLword *pDVar10;
  long lVar11;
  char ver [16];
  char host [255];
  statvfs sfsbuf;
  char name [256];
  char lfname [4101];
  char dir [4096];
  char file [4096];
  char local_32c8 [16];
  undefined4 local_32b8;
  char local_32b4;
  statvfs local_31b8;
  char local_3148 [256];
  char local_3048 [4112];
  char local_2038 [4096];
  char local_1038 [4104];
  long lVar6;
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 == 0) {
    Lisp_errno = &Dummy_errno;
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
    }
    else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
    }
    else {
      iVar4 = error("LispStringLength: Not a character array.\n");
    }
    if (iVar4 < 0x1005) {
      uVar2 = *args;
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      iVar5 = 0x1000;
      if (iVar4 < 0x1000) {
        iVar5 = iVar4;
      }
      lVar6 = (long)iVar5;
      if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
        if (iVar4 == 0) {
          pcVar7 = local_3048;
        }
        else {
          lVar6 = lVar6 + (ulong)(lVar6 == 0);
          pDVar10 = Lisp_world +
                    (ulong)Lisp_world[(ulong)uVar2 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
          pcVar7 = local_3048;
          do {
            *pcVar7 = *(char *)((ulong)pDVar10 ^ 2);
            pcVar7 = pcVar7 + 1;
            pDVar10 = pDVar10 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        *pcVar7 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
        if (iVar4 != 0) {
          uVar3 = *(uint *)(Lisp_world + uVar2);
          uVar1 = Lisp_world[(ulong)uVar2 + 2];
          lVar11 = 0;
          do {
            local_3048[lVar11] =
                 *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2
                          ^ 3);
            lVar11 = lVar11 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
        }
        local_3048[lVar6] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      uVar2 = args[1];
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      pDVar10 = Lisp_world;
      separate_host(local_3048,(char *)&local_32b8);
      if ((char)local_32b8 != '\0') {
        pcVar7 = (char *)((long)&local_32b8 + 1);
        cVar9 = (char)local_32b8;
        do {
          if ((byte)(cVar9 + 0x9fU) < 0x1a) {
            pcVar7[-1] = cVar9 + -0x20;
          }
          cVar9 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while (cVar9 != '\0');
      }
      if ((local_32b8 != 0x4b5344) && (local_32b4 != '\0' || local_32b8 != 0x58494e55)) {
        return 0;
      }
      iVar4 = unixpathname(local_3048,local_1038,0,0);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = unpack_filename(local_1038,local_2038,local_3148,local_32c8,0);
      if (iVar4 == 0) {
        return 0;
      }
      if ((local_32b8 == 0x4b5344) && (iVar4 = true_name(local_2038), iVar4 != -1)) {
        return 0;
      }
      alarm(TIMEOUT_TIME);
      piVar8 = __errno_location();
      do {
        *piVar8 = 0;
        iVar4 = statvfs(local_2038,&local_31b8);
        if (iVar4 != -1) break;
      } while (*piVar8 == 4);
      alarm(0);
      if (iVar4 != 0) {
        *Lisp_errno = *piVar8;
        return 0;
      }
      *(undefined4 *)(pDVar10 + uVar2) = (undefined4)local_31b8.f_bavail;
      return 0x4c;
    }
    *Lisp_errno = 200;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_getfreeblock(LispPTR *args)
{
  int dskp, rval, *buf;
  char lfname[MAXPATHLEN + 5], dir[MAXPATHLEN], host[MAXNAMLEN];
  char name[MAXNAMLEN + 1], file[MAXPATHLEN], ver[VERSIONLEN];
#ifdef DOS
  char drive[2];
  struct diskfree_t sfsbuf;
#else
  struct statvfs sfsbuf;
#endif

  ERRSETJMP(NIL);
  Lisp_errno = &Dummy_errno;

  LispStringLength(args[0], rval, dskp);
  /*
   * Add 1 byte for NULL terminating character.
   */
  rval += 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
  buf = (int *)NativeAligned4FromLAddr(args[1]);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

#ifdef DOS
  if (!unixpathname(lfname, file, 0, 0, drive, 0, 0)) return (NIL);
#else  /* DOS */
  if (!unixpathname(lfname, file, 0, 0)) return (NIL);
#endif /* DOS */

  if (!unpack_filename(file, dir, name, ver, 0)) return (NIL);

  if (dskp) {
    /*
     * Although Lisp code guarantees the directory is an existing one,
     * by calling DSK_getfilename, we check it again for safety.
     */
    if (true_name(dir) != -1) return (NIL);
  }

/*
 * The specified file itself might be a file being created newly.  Thus,
 * we check the available block size, using the directory on which the file
 * will be exist.
 */
#ifdef DOS
  /* For DOS, we have to use either the disk drive the file
     will be on, or the default drive. */

  if (drive[0]) {
    drive[1] = 0;
    UPCASE(drive);
    if (_dos_getdiskfree((unsigned)drive[0] - (int)'@', &sfsbuf))
      return (NIL); /* call failed, so name is invalid */

    *buf = sfsbuf.avail_clusters * sfsbuf.sectors_per_cluster * sfsbuf.bytes_per_sector;
  } else {
    if (_dos_getdiskfree(0, &sfsbuf)) return (NIL); /* call failed, so name is invalid */

    *buf = sfsbuf.avail_clusters * sfsbuf.sectors_per_cluster * sfsbuf.bytes_per_sector;
  }
#else
  TIMEOUT(rval = statvfs(dir, &sfsbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }
  *buf = sfsbuf.f_bavail;
#endif /* DOS */
  return (ATOM_T);
}